

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# single_file_block_manager.cpp
# Opt level: O3

void __thiscall
duckdb::SingleFileBlockManager::IncreaseBlockReferenceCount
          (SingleFileBlockManager *this,block_id_t block_id)

{
  int iVar1;
  
  iVar1 = pthread_mutex_lock((pthread_mutex_t *)&this->block_lock);
  if (iVar1 == 0) {
    IncreaseBlockReferenceCountInternal(this,block_id);
    pthread_mutex_unlock((pthread_mutex_t *)&this->block_lock);
    return;
  }
  ::std::__throw_system_error(iVar1);
}

Assistant:

void SingleFileBlockManager::IncreaseBlockReferenceCount(block_id_t block_id) {
	lock_guard<mutex> lock(block_lock);
	IncreaseBlockReferenceCountInternal(block_id);
}